

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O0

void do_cleave(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  int stat;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  CClass *this;
  OBJ_DATA *pOVar7;
  CHAR_DATA *pCVar8;
  char *pcVar9;
  CHAR_DATA *in_RDI;
  int skill;
  int sn;
  char buf [4608];
  int dam_type;
  int chance;
  int dam;
  char arg [4608];
  CHAR_DATA *victim;
  OBJ_DATA *weapon;
  undefined4 in_stack_ffffffffffffdb88;
  int in_stack_ffffffffffffdb8c;
  int in_stack_ffffffffffffdb90;
  undefined4 in_stack_ffffffffffffdb94;
  CHAR_DATA *in_stack_ffffffffffffdb98;
  CHAR_DATA *in_stack_ffffffffffffdba0;
  int in_stack_ffffffffffffdba8;
  undefined1 show;
  undefined4 in_stack_ffffffffffffdbac;
  skill_type *psVar10;
  undefined4 in_stack_ffffffffffffdbb8;
  undefined4 in_stack_ffffffffffffdbc0;
  int iVar11;
  undefined4 in_stack_ffffffffffffdbc4;
  CHAR_DATA *in_stack_ffffffffffffdbf0;
  CHAR_DATA *in_stack_ffffffffffffdbf8;
  int in_stack_ffffffffffffdc64;
  undefined1 in_stack_ffffffffffffdc6b;
  int in_stack_ffffffffffffdc6c;
  CHAR_DATA *in_stack_ffffffffffffdc70;
  int in_stack_ffffffffffffdc8c;
  GEN_DATA *in_stack_ffffffffffffdc90;
  int in_stack_ffffffffffffed88;
  int in_stack_ffffffffffffed8c;
  CHAR_DATA *in_stack_ffffffffffffed90;
  CHAR_DATA *in_stack_ffffffffffffed98;
  int local_1230;
  
  iVar2 = get_skill((CHAR_DATA *)in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc8c);
  if (iVar2 != 0) {
    stat = (int)in_RDI->level;
    psVar10 = skill_table + gsn_cleave;
    this = char_data::Class(in_stack_ffffffffffffdba0);
    iVar3 = CClass::GetIndex(this);
    if (psVar10->skill_level[iVar3] <= stat) {
      one_argument((char *)CONCAT44(in_stack_ffffffffffffdb94,in_stack_ffffffffffffdb90),
                   (char *)CONCAT44(in_stack_ffffffffffffdb8c,in_stack_ffffffffffffdb88));
      pOVar7 = get_eq_char(in_RDI,0x10);
      if (pOVar7 == (OBJ_DATA *)0x0) {
        send_to_char((char *)in_stack_ffffffffffffdba0,in_stack_ffffffffffffdb98);
        return;
      }
      if ((pOVar7->value[0] != 1) && (pOVar7->value[0] != 5)) {
        send_to_char((char *)in_stack_ffffffffffffdba0,in_stack_ffffffffffffdb98);
        return;
      }
      pCVar8 = get_char_room(in_stack_ffffffffffffed98,(char *)in_stack_ffffffffffffed90);
      if (pCVar8 == (CHAR_DATA *)0x0) {
        send_to_char((char *)in_stack_ffffffffffffdba0,in_stack_ffffffffffffdb98);
        return;
      }
      if (pCVar8 == in_RDI) {
        send_to_char((char *)in_stack_ffffffffffffdba0,in_stack_ffffffffffffdb98);
        return;
      }
      if (pCVar8->fighting != (CHAR_DATA *)0x0) {
        send_to_char((char *)in_stack_ffffffffffffdba0,in_stack_ffffffffffffdb98);
        return;
      }
      if (10000 < pCVar8->hit) {
        send_to_char((char *)in_stack_ffffffffffffdba0,in_stack_ffffffffffffdb98);
        return;
      }
      bVar1 = is_safe((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb94,in_stack_ffffffffffffdb90),
                      (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb8c,in_stack_ffffffffffffdb88));
      if (bVar1) {
        return;
      }
      bVar1 = check_shroud_of_light(in_stack_ffffffffffffdbf8,in_stack_ffffffffffffdbf0);
      if (bVar1) {
        return;
      }
      bVar1 = check_sidestep(in_stack_ffffffffffffed98,in_stack_ffffffffffffed90,
                             in_stack_ffffffffffffed8c,in_stack_ffffffffffffed88);
      if (bVar1) {
        return;
      }
      if ((int)in_RDI->level - (int)pCVar8->level < 0) {
        local_1230 = ((int)in_RDI->level - (int)pCVar8->level) * -3;
      }
      else {
        local_1230 = (int)in_RDI->level - (int)pCVar8->level;
      }
      local_1230 = iVar2 / 5 + local_1230;
      iVar2 = get_curr_stat((CHAR_DATA *)
                            CONCAT44(in_stack_ffffffffffffdbc4,in_stack_ffffffffffffdbc0),stat);
      iVar3 = get_curr_stat((CHAR_DATA *)
                            CONCAT44(in_stack_ffffffffffffdbc4,in_stack_ffffffffffffdbc0),stat);
      iVar4 = get_curr_stat((CHAR_DATA *)
                            CONCAT44(in_stack_ffffffffffffdbc4,in_stack_ffffffffffffdbc0),stat);
      iVar5 = get_curr_stat((CHAR_DATA *)
                            CONCAT44(in_stack_ffffffffffffdbc4,in_stack_ffffffffffffdbc0),stat);
      local_1230 = (((iVar2 / 2 + local_1230) - iVar3 / 3) - iVar4 / 4) - iVar5 / 4;
      std::vector<attack_type,_std::allocator<attack_type>_>::operator[]
                (&attack_table,(long)pOVar7->value[3]);
      bVar1 = can_see((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbac,in_stack_ffffffffffffdba8),
                      in_stack_ffffffffffffdba0);
      if (!bVar1) {
        local_1230 = local_1230 + 5;
      }
      iVar2 = dice(in_stack_ffffffffffffdb90,in_stack_ffffffffffffdb8c);
      iVar2 = local_1230 - iVar2;
      if (iVar2 < 1) {
        iVar2 = in_stack_ffffffffffffdba8;
        local_1230 = 1;
      }
      else {
        local_1230 = iVar2;
        if (6 < iVar2) {
          iVar2 = 6;
          local_1230 = iVar2;
        }
      }
      show = (undefined1)((uint)iVar2 >> 0x18);
      iVar2 = local_1230;
      iVar3 = number_percent();
      if (iVar3 < 0x32) {
        in_stack_ffffffffffffdba0 = (CHAR_DATA *)&stack0xffffffffffffdbc8;
        pcVar9 = pers(in_stack_ffffffffffffdb98,
                      (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb94,in_stack_ffffffffffffdb90));
        sprintf((char *)in_stack_ffffffffffffdba0,"Die, %s you butchering fool!",pcVar9);
      }
      else {
        in_stack_ffffffffffffdb98 = (CHAR_DATA *)&stack0xffffffffffffdbc8;
        pcVar9 = pers(in_stack_ffffffffffffdb98,
                      (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb94,in_stack_ffffffffffffdb90));
        sprintf((char *)in_stack_ffffffffffffdb98,"Help! %s just tried to cleave me in half!",pcVar9
               );
      }
      iVar3 = get_weapon_sn((CHAR_DATA *)0x5e9d02);
      iVar4 = get_weapon_skill((CHAR_DATA *)
                               CONCAT44(in_stack_ffffffffffffdb94,in_stack_ffffffffffffdb90),
                               in_stack_ffffffffffffdb8c);
      iVar5 = get_skill((CHAR_DATA *)in_stack_ffffffffffffdc90,in_stack_ffffffffffffdc8c);
      iVar5 = iVar4 + iVar5 + 10;
      if (iVar5 / 2 < 0) {
        iVar5 = 0;
      }
      else if (iVar5 / 2 < 0x65) {
        in_stack_ffffffffffffdb8c = iVar5 / 2;
        iVar5 = in_stack_ffffffffffffdb8c;
      }
      else {
        in_stack_ffffffffffffdb8c = 100;
        iVar5 = in_stack_ffffffffffffdb8c;
      }
      iVar11 = iVar5;
      bVar1 = IS_IMP((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb8c,in_stack_ffffffffffffdb88));
      if (bVar1) {
        local_1230 = local_1230 + 100;
      }
      act((char *)in_stack_ffffffffffffdba0,in_stack_ffffffffffffdb98,(void *)CONCAT44(iVar4,iVar5),
          (void *)CONCAT44(in_stack_ffffffffffffdb8c,in_stack_ffffffffffffdb88),0);
      act((char *)in_stack_ffffffffffffdba0,in_stack_ffffffffffffdb98,(void *)CONCAT44(iVar4,iVar5),
          (void *)CONCAT44(in_stack_ffffffffffffdb8c,in_stack_ffffffffffffdb88),0);
      act((char *)in_stack_ffffffffffffdba0,in_stack_ffffffffffffdb98,(void *)CONCAT44(iVar4,iVar5),
          (void *)CONCAT44(in_stack_ffffffffffffdb8c,in_stack_ffffffffffffdb88),0);
      bVar1 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb8c,in_stack_ffffffffffffdb88));
      if (bVar1) {
        pCVar8->last_fought = in_RDI;
      }
      iVar6 = number_percent();
      if (local_1230 < iVar6) {
        check_improve(in_stack_ffffffffffffdc70,in_stack_ffffffffffffdc6c,
                      (bool)in_stack_ffffffffffffdc6b,in_stack_ffffffffffffdc64);
        if ((pOVar7->pIndexData->new_format & 1U) == 0) {
          number_range(iVar5,in_stack_ffffffffffffdb8c);
        }
        else {
          dice(iVar5,in_stack_ffffffffffffdb8c);
        }
        number_range(iVar5,in_stack_ffffffffffffdb8c);
        damage_old((CHAR_DATA *)CONCAT44(iVar3,iVar11),
                   (CHAR_DATA *)CONCAT44(stat,in_stack_ffffffffffffdbb8),
                   (int)((ulong)psVar10 >> 0x20),(int)psVar10,iVar2,(bool)show);
        bVar1 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdb8c,in_stack_ffffffffffffdb88));
        if (((!bVar1) &&
            (bVar1 = is_npc((CHAR_DATA *)
                            CONCAT44(in_stack_ffffffffffffdb8c,in_stack_ffffffffffffdb88)), !bVar1))
           && (1 < pCVar8->hit)) {
          do_myell(in_stack_ffffffffffffdba0,(char *)in_stack_ffffffffffffdb98,
                   (CHAR_DATA *)CONCAT44(iVar4,iVar5));
        }
        WAIT_STATE(in_stack_ffffffffffffdba0,(int)((ulong)in_stack_ffffffffffffdb98 >> 0x20));
        LAG_CHAR((CHAR_DATA *)CONCAT44(iVar4,iVar5),in_stack_ffffffffffffdb8c);
        return;
      }
      act((char *)in_stack_ffffffffffffdba0,in_stack_ffffffffffffdb98,(void *)CONCAT44(iVar4,iVar5),
          (void *)CONCAT44(in_stack_ffffffffffffdb8c,in_stack_ffffffffffffdb88),0);
      act((char *)in_stack_ffffffffffffdba0,in_stack_ffffffffffffdb98,(void *)CONCAT44(iVar4,iVar5),
          (void *)CONCAT44(in_stack_ffffffffffffdb8c,in_stack_ffffffffffffdb88),0);
      act((char *)in_stack_ffffffffffffdba0,in_stack_ffffffffffffdb98,(void *)CONCAT44(iVar4,iVar5),
          (void *)CONCAT44(in_stack_ffffffffffffdb8c,in_stack_ffffffffffffdb88),0);
      check_improve(in_stack_ffffffffffffdc70,in_stack_ffffffffffffdc6c,
                    (bool)in_stack_ffffffffffffdc6b,in_stack_ffffffffffffdc64);
      raw_kill((CHAR_DATA *)arg._288_8_,(CHAR_DATA *)arg._280_8_);
      return;
    }
  }
  send_to_char((char *)in_stack_ffffffffffffdba0,in_stack_ffffffffffffdb98);
  return;
}

Assistant:

void do_cleave(CHAR_DATA *ch, char *argument)
{
	OBJ_DATA *weapon;
	CHAR_DATA *victim;
	char arg[MAX_INPUT_LENGTH];
	int dam, chance, dam_type;
	char buf[MAX_STRING_LENGTH];
	int sn;
	int skill;

	chance = get_skill(ch, gsn_cleave);

	if (chance == 0 ||
		ch->level < skill_table[gsn_cleave].skill_level[ch->Class()->GetIndex()])
	{
		send_to_char("You don't know how to cleave.\n\r", ch);
		return;
	}

	one_argument(argument, arg);
	weapon = get_eq_char(ch, WEAR_WIELD);

	if (weapon == nullptr)
	{
		send_to_char("You need to wield a sword or axe to cleave.\n\r", ch);
		return;
	}

	if (weapon->value[0] != WEAPON_SWORD && weapon->value[0] != WEAPON_AXE)
	{
		send_to_char("You need to wield a sword or axe to cleave.\n\r", ch);
		return;
	}

	victim = get_char_room(ch, arg);

	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	if (victim == ch)
	{
		send_to_char("You can't do such a thing.\n\r", ch);
		return;
	}

	if (victim->fighting != nullptr)
	{
		send_to_char("They are moving too much to cleave.\n\r", ch);
		return;
	}

	if (victim->hit > 10000)
	{
		send_to_char("They are much too massive to cut through in a single cleave.\n\r", ch);
		return;
	}

	if (is_safe(ch, victim))
		return;

	if (check_shroud_of_light(ch, victim))
		return;

	if (check_sidestep(ch, victim, gsn_cleave, 95))
		return;

	chance /= 5;

	if ((ch->level - victim->level) < 0)
		chance -= (ch->level - victim->level) * 3;
	else
		chance += (ch->level - victim->level);

	chance += get_curr_stat(ch, STAT_STR) / 2;
	chance -= get_curr_stat(victim, STAT_DEX) / 3; /* Improve evasion */
	chance -= get_curr_stat(victim, STAT_STR) / 4; /* Improve repelling */
	chance -= get_curr_stat(victim, STAT_CON) / 4; /* Shock survival */
	dam_type = attack_table[weapon->value[3]].damage;

	if (!can_see(victim, ch))
		chance += 5;

	chance -= dice(2, 6);
	chance = URANGE(1, chance, 6);

	if (number_percent() < 50)
		sprintf(buf, "Die, %s you butchering fool!", pers(ch, victim));
	else
		sprintf(buf, "Help! %s just tried to cleave me in half!", pers(ch, victim));

	sn = get_weapon_sn(ch);
	skill = get_weapon_skill(ch, sn) + get_skill(ch, gsn_cleave) + 10;
	skill = URANGE(0, skill / 2, 100);

	if (IS_IMP(ch))
		chance += 100;

	act("You make a brutal swing at $N in an attempt to cleave them in half.", ch, 0, victim, TO_CHAR);
	act("$n attempts to cleave you in half with a brutal slice.", ch, 0, victim, TO_VICT);
	act("$n makes an attempt to cleave $N in half.", ch, 0, victim, TO_NOTVICT);

	if (is_npc(victim))
		victim->last_fought = ch;

	if (number_percent() > chance)
	{
		check_improve(ch, gsn_cleave, false, 5);

		if (weapon->pIndexData->new_format)
			dam = dice(weapon->value[1], weapon->value[2]) * skill / 100;
		else
			dam = number_range(weapon->value[1] * skill / 100, weapon->value[2] * skill / 100);

		dam *= number_range(ch->level / 10, ch->level / 7);

		damage_old(ch, victim, dam, gsn_cleave, dam_type, true);

		if (!is_npc(victim) && !is_npc(ch) && victim->hit > 1)
			do_myell(victim, buf, ch);

		WAIT_STATE(ch, PULSE_VIOLENCE * 3);
		LAG_CHAR(victim, PULSE_VIOLENCE * 2);
		return;
	}

	act("Your cleave slices $S body in half with a clean cut!", ch, 0, victim, TO_CHAR);
	act("$n cleaves you in half, tearing your body into two bloody bits!", ch, 0, victim, TO_VICT);
	act("$n cleaves $N into bits of bloody flesh!", ch, 0, victim, TO_NOTVICT);
	check_improve(ch, gsn_cleave, true, 5);
	raw_kill(ch, victim);
}